

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_cb_dbg.c
# Opt level: O1

int tool_debug_cb(CURL *handle,curl_infotype type,char *data,size_t size,void *userdata)

{
  trace tVar1;
  GlobalConfig *config;
  char cVar2;
  int iVar3;
  time_t tVar4;
  tm *ptVar5;
  FILE *pFVar6;
  char *pcVar7;
  FILE *__stream;
  size_t sVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  size_t sVar13;
  ulong uVar14;
  timeval tVar15;
  char timebuf [20];
  time_t secs;
  undefined1 local_68 [24];
  ulong local_50;
  ulong local_48;
  char *local_40;
  long local_38;
  
  config = *(GlobalConfig **)((long)userdata + 0x468);
  __stream = (FILE *)config->errors;
  if (config->tracetime == true) {
    tVar15 = tvnow();
    if (tool_debug_cb_known_offset == '\0') {
      tVar4 = time((time_t *)0x0);
      tool_debug_cb::epoch_offset = tVar4 - tVar15.tv_sec;
      tool_debug_cb_known_offset = '\x01';
    }
    local_38 = tool_debug_cb::epoch_offset + tVar15.tv_sec;
    ptVar5 = localtime(&local_38);
    curl_msnprintf(local_68,0x14,"%02d:%02d:%02d.%06ld ",ptVar5->tm_hour,ptVar5->tm_min,
                   ptVar5->tm_sec,tVar15.tv_usec);
  }
  else {
    local_68[0] = 0;
  }
  if (config->trace_stream == (FILE *)0x0) {
    pcVar7 = config->trace_dump;
    iVar3 = strcmp("-",pcVar7);
    pFVar6 = _stdout;
    if (iVar3 != 0) {
      iVar3 = strcmp("%",pcVar7);
      if (iVar3 != 0) {
        pFVar6 = fopen64(pcVar7,"w");
        config->trace_stream = (FILE *)pFVar6;
        config->trace_fopened = true;
        goto LAB_0010ba78;
      }
      pFVar6 = (FILE *)config->errors;
    }
    config->trace_stream = (FILE *)pFVar6;
  }
LAB_0010ba78:
  if ((FILE *)config->trace_stream != (FILE *)0x0) {
    __stream = (FILE *)config->trace_stream;
  }
  if (__stream == (FILE *)0x0) {
    warnf(config,"Failed to create/open output");
    return 0;
  }
  tVar1 = config->tracetype;
  if (tVar1 == TRACE_PLAIN) {
    if (type - CURLINFO_DATA_IN < 4) {
      if (tool_debug_cb_traced_data != '\0') {
        return 0;
      }
      if (config->isatty == true) {
        if (__stream == _stderr) {
          return 0;
        }
        if (__stream == _stdout) {
          return 0;
        }
      }
      if (tool_debug_cb::newl == false) {
        curl_mfprintf(__stream,"%s%s ",local_68,tool_debug_cb::s_infotype[type]);
      }
      curl_mfprintf(__stream,"[%zd bytes data]\n",size);
      tool_debug_cb::newl = false;
      tool_debug_cb_traced_data = 1;
      return 0;
    }
    if (type < CURLINFO_HEADER_OUT) {
      if (tool_debug_cb::newl == false) {
        curl_mfprintf(__stream,"%s%s ",local_68,tool_debug_cb::s_infotype[type]);
      }
      fwrite(data,size,1,__stream);
      if (size == 0) {
        tool_debug_cb::newl = false;
        tool_debug_cb_traced_data = 0;
        return 0;
      }
      cVar2 = data[size - 1];
    }
    else {
      if (type != CURLINFO_HEADER_OUT) {
        tool_debug_cb::newl = false;
        tool_debug_cb_traced_data = 0;
        return 0;
      }
      if (size == 0) {
        tool_debug_cb::newl = false;
        tool_debug_cb_traced_data = 0;
        return 0;
      }
      sVar13 = 1;
      if (size == 1) {
        sVar8 = 0;
        lVar11 = 0;
      }
      else {
        lVar11 = 0;
        sVar8 = 0;
        do {
          if (data[sVar13 - 1] == '\n') {
            if (tool_debug_cb::newl == false) {
              curl_mfprintf(__stream,"%s%s ",local_68,">");
            }
            fwrite(data + sVar8,lVar11 + sVar13,1,__stream);
            tool_debug_cb::newl = false;
            sVar8 = sVar13;
          }
          lVar11 = -sVar8;
          sVar13 = sVar13 + 1;
        } while (size != sVar13);
      }
      if (tool_debug_cb::newl == false) {
        curl_mfprintf(__stream,"%s%s ",local_68,">");
      }
      fwrite(data + sVar8,sVar13 + lVar11,1,__stream);
      cVar2 = data[size - 1];
    }
    tool_debug_cb::newl = cVar2 != '\n';
    tool_debug_cb_traced_data = 0;
    return 0;
  }
  switch(type) {
  case CURLINFO_TEXT:
    curl_mfprintf(__stream,"%s== Info: %s",local_68,data);
    return 0;
  case CURLINFO_HEADER_IN:
    pcVar7 = "<= Recv header";
    break;
  case CURLINFO_HEADER_OUT:
    pcVar7 = "=> Send header";
    break;
  case CURLINFO_DATA_IN:
    pcVar7 = "<= Recv data";
    break;
  case CURLINFO_DATA_OUT:
    pcVar7 = "=> Send data";
    break;
  case CURLINFO_SSL_DATA_IN:
    pcVar7 = "<= Recv SSL data";
    break;
  case CURLINFO_SSL_DATA_OUT:
    pcVar7 = "=> Send SSL data";
    break;
  default:
    goto switchD_0010bb64_default;
  }
  curl_mfprintf(__stream,"%s%s, %zd bytes (0x%zx)\n",local_68,pcVar7,size,size);
  if (size != 0) {
    local_48 = 0xfffffffffffffff0;
    if (tVar1 == TRACE_ASCII) {
      local_48 = 0xffffffffffffffc0;
    }
    lVar11 = 0x10;
    if (tVar1 == TRACE_ASCII) {
      lVar11 = 0x40;
    }
    local_50 = local_48 ^ 0xfffffffffffffffd;
    local_48 = local_48 ^ 0xfffffffffffffffe;
    uVar14 = 0;
    local_40 = data;
    do {
      pcVar7 = local_40;
      curl_mfprintf(__stream,"%04zx: ",uVar14);
      lVar9 = lVar11;
      uVar10 = uVar14;
      if (tVar1 == TRACE_BIN) {
        do {
          if (uVar10 < size) {
            curl_mfprintf(__stream,"%02x ",pcVar7[uVar10]);
          }
          else {
            fputs("   ",__stream);
          }
          lVar9 = lVar9 + -1;
          uVar10 = uVar10 + 1;
        } while (lVar9 != 0);
      }
      lVar9 = 0;
      uVar10 = local_48;
      uVar12 = local_50;
      do {
        if (size <= uVar14 + lVar9) break;
        if (tVar1 == TRACE_ASCII) {
          if (((uVar14 + lVar9 + 1 < size) && (pcVar7[uVar14] == '\r')) &&
             (pcVar7[uVar14 + 1] == '\n')) {
            uVar14 = uVar14 - uVar10;
            break;
          }
          cVar2 = pcVar7[uVar14];
          if (cVar2 < ' ') {
            cVar2 = '.';
          }
          curl_mfprintf(__stream,"%c",cVar2);
          if (((uVar14 + lVar9 + 2 < size) && (pcVar7[uVar14 + 1] == '\r')) &&
             (pcVar7[uVar14 + 2] == '\n')) {
            uVar14 = uVar14 - uVar12;
            break;
          }
        }
        else {
          cVar2 = pcVar7[uVar14];
          if (cVar2 < ' ') {
            cVar2 = '.';
          }
          curl_mfprintf(__stream,"%c",cVar2);
        }
        lVar9 = lVar9 + 1;
        uVar12 = uVar12 - 1;
        uVar10 = uVar10 - 1;
        pcVar7 = pcVar7 + 1;
      } while (lVar11 != lVar9);
      fputc(10,__stream);
      uVar14 = uVar14 + lVar11;
    } while (uVar14 < size);
  }
  fflush(__stream);
switchD_0010bb64_default:
  return 0;
}

Assistant:

int tool_debug_cb(CURL *handle, curl_infotype type,
                  char *data, size_t size,
                  void *userdata)
{
  struct OperationConfig *operation = userdata;
  struct GlobalConfig *config = operation->global;
  FILE *output = config->errors;
  const char *text;
  struct timeval tv;
  struct tm *now;
  char timebuf[20];
  time_t secs;
  static time_t epoch_offset;
  static int    known_offset;

  (void)handle; /* not used */

  if(config->tracetime) {
    tv = tvnow();
    if(!known_offset) {
      epoch_offset = time(NULL) - tv.tv_sec;
      known_offset = 1;
    }
    secs = epoch_offset + tv.tv_sec;
    now = localtime(&secs);  /* not thread safe but we don't care */
    snprintf(timebuf, sizeof(timebuf), "%02d:%02d:%02d.%06ld ",
             now->tm_hour, now->tm_min, now->tm_sec, (long)tv.tv_usec);
  }
  else
    timebuf[0] = 0;

  if(!config->trace_stream) {
    /* open for append */
    if(!strcmp("-", config->trace_dump))
      config->trace_stream = stdout;
    else if(!strcmp("%", config->trace_dump))
      /* Ok, this is somewhat hackish but we do it undocumented for now */
      config->trace_stream = config->errors;  /* aka stderr */
    else {
      config->trace_stream = fopen(config->trace_dump, FOPEN_WRITETEXT);
      config->trace_fopened = TRUE;
    }
  }

  if(config->trace_stream)
    output = config->trace_stream;

  if(!output) {
    warnf(config, "Failed to create/open output");
    return 0;
  }

  if(config->tracetype == TRACE_PLAIN) {
    /*
     * This is the trace look that is similar to what libcurl makes on its
     * own.
     */
    static const char * const s_infotype[] = {
      "*", "<", ">", "{", "}", "{", "}"
    };
    size_t i;
    size_t st = 0;
    static bool newl = FALSE;
    static bool traced_data = FALSE;

    switch(type) {
    case CURLINFO_HEADER_OUT:
      if(size > 0) {
        for(i = 0; i < size - 1; i++) {
          if(data[i] == '\n') { /* LF */
            if(!newl) {
              fprintf(output, "%s%s ", timebuf, s_infotype[type]);
            }
            (void)fwrite(data + st, i - st + 1, 1, output);
            st = i + 1;
            newl = FALSE;
          }
        }
        if(!newl)
          fprintf(output, "%s%s ", timebuf, s_infotype[type]);
        (void)fwrite(data + st, i - st + 1, 1, output);
      }
      newl = (size && (data[size - 1] != '\n')) ? TRUE : FALSE;
      traced_data = FALSE;
      break;
    case CURLINFO_TEXT:
    case CURLINFO_HEADER_IN:
      if(!newl)
        fprintf(output, "%s%s ", timebuf, s_infotype[type]);
      (void)fwrite(data, size, 1, output);
      newl = (size && (data[size - 1] != '\n')) ? TRUE : FALSE;
      traced_data = FALSE;
      break;
    case CURLINFO_DATA_OUT:
    case CURLINFO_DATA_IN:
    case CURLINFO_SSL_DATA_IN:
    case CURLINFO_SSL_DATA_OUT:
      if(!traced_data) {
        /* if the data is output to a tty and we're sending this debug trace
           to stderr or stdout, we don't display the alert about the data not
           being shown as the data _is_ shown then just not via this
           function */
        if(!config->isatty || ((output != stderr) && (output != stdout))) {
          if(!newl)
            fprintf(output, "%s%s ", timebuf, s_infotype[type]);
          fprintf(output, "[%zd bytes data]\n", size);
          newl = FALSE;
          traced_data = TRUE;
        }
      }
      break;
    default: /* nada */
      newl = FALSE;
      traced_data = FALSE;
      break;
    }

    return 0;
  }

#ifdef CURL_DOES_CONVERSIONS
  /* Special processing is needed for CURLINFO_HEADER_OUT blocks
   * if they contain both headers and data (separated by CRLFCRLF).
   * We dump the header text and then switch type to CURLINFO_DATA_OUT.
   */
  if((type == CURLINFO_HEADER_OUT) && (size > 4)) {
    size_t i;
    for(i = 0; i < size - 4; i++) {
      if(memcmp(&data[i], "\r\n\r\n", 4) == 0) {
        /* dump everything through the CRLFCRLF as a sent header */
        text = "=> Send header";
        dump(timebuf, text, output, (unsigned char *)data, i + 4,
             config->tracetype, type);
        data += i + 3;
        size -= i + 4;
        type = CURLINFO_DATA_OUT;
        data += 1;
        break;
      }
    }
  }
#endif /* CURL_DOES_CONVERSIONS */

  switch(type) {
  case CURLINFO_TEXT:
    fprintf(output, "%s== Info: %s", timebuf, data);
    /* FALLTHROUGH */
  default: /* in case a new one is introduced to shock us */
    return 0;

  case CURLINFO_HEADER_OUT:
    text = "=> Send header";
    break;
  case CURLINFO_DATA_OUT:
    text = "=> Send data";
    break;
  case CURLINFO_HEADER_IN:
    text = "<= Recv header";
    break;
  case CURLINFO_DATA_IN:
    text = "<= Recv data";
    break;
  case CURLINFO_SSL_DATA_IN:
    text = "<= Recv SSL data";
    break;
  case CURLINFO_SSL_DATA_OUT:
    text = "=> Send SSL data";
    break;
  }

  dump(timebuf, text, output, (unsigned char *) data, size, config->tracetype,
       type);
  return 0;
}